

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

char * __thiscall
icu_63::RuleBasedCollator::internalGetLocaleID
          (RuleBasedCollator *this,ULocDataLocaleType type,UErrorCode *errorCode)

{
  Locale *pLVar1;
  char *pcVar2;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (type == ULOC_VALID_LOCALE) {
      pLVar1 = &this->validLocale;
    }
    else {
      if (type != ULOC_ACTUAL_LOCALE) {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return (char *)0x0;
      }
      pLVar1 = &this->tailoring->actualLocale;
      if (this->actualLocaleIsSameAsValid != '\0') {
        pLVar1 = &this->validLocale;
      }
    }
    if (pLVar1->fIsBogus == '\0') {
      pcVar2 = "root";
      if (*pLVar1->fullName != '\0') {
        pcVar2 = pLVar1->fullName;
      }
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }